

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeFreeCursorNN(Vdbe *p,VdbeCursor *pCx)

{
  long *plVar1;
  u8 uVar2;
  VdbeSorter *pSorter;
  sqlite3 *db;
  long *plVar3;
  BtCursor *pCur;
  Btree *p_00;
  BtShared *pBt;
  BtCursor *pBVar4;
  BtCursor *pBVar5;
  BtCursor **ppBVar6;
  
  uVar2 = pCx->eCurType;
  if (uVar2 == '\0') {
    pCur = (pCx->uc).pCursor;
    p_00 = pCur->pBtree;
    if (p_00 != (Btree *)0x0) {
      pBt = pCur->pBt;
      sqlite3BtreeEnter(p_00);
      pBVar5 = pBt->pCursor;
      ppBVar6 = &pBt->pCursor;
      if (pBt->pCursor == pCur) {
LAB_00131307:
        *ppBVar6 = pCur->pNext;
      }
      else {
        do {
          pBVar4 = pBVar5->pNext;
          if (pBVar4 == pCur) {
            ppBVar6 = &pBVar5->pNext;
            goto LAB_00131307;
          }
          pBVar5 = pBVar4;
        } while (pBVar4 != (BtCursor *)0x0);
      }
      btreeReleaseAllCursorPages(pCur);
      unlockBtreeIfUnused(pBt);
      sqlite3_free(pCur->aOverflow);
      sqlite3_free(pCur->pKey);
      if (((pBt->openFlags & 4) == 0) || (pBt->pCursor != (BtCursor *)0x0)) {
        sqlite3BtreeLeave(p_00);
      }
      else {
        sqlite3BtreeClose(p_00);
      }
      pCur->pBtree = (Btree *)0x0;
    }
  }
  else {
    if (uVar2 == '\x02') {
      plVar3 = *(long **)(pCx->uc).pCursor;
      plVar1 = plVar3 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      (**(code **)(*plVar3 + 0x38))();
      return;
    }
    if ((uVar2 == '\x01') && (pSorter = (pCx->uc).pSorter, pSorter != (VdbeSorter *)0x0)) {
      db = p->db;
      sqlite3VdbeSorterReset(db,pSorter);
      sqlite3_free((pSorter->list).aMemory);
      sqlite3DbFreeNN(db,pSorter);
      (pCx->uc).pCursor = (BtCursor *)0x0;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeFreeCursorNN(Vdbe *p, VdbeCursor *pCx){
  switch( pCx->eCurType ){
    case CURTYPE_SORTER: {
      sqlite3VdbeSorterClose(p->db, pCx);
      break;
    }
    case CURTYPE_BTREE: {
      assert( pCx->uc.pCursor!=0 );
      sqlite3BtreeCloseCursor(pCx->uc.pCursor);
      break;
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    case CURTYPE_VTAB: {
      sqlite3_vtab_cursor *pVCur = pCx->uc.pVCur;
      const sqlite3_module *pModule = pVCur->pVtab->pModule;
      assert( pVCur->pVtab->nRef>0 );
      pVCur->pVtab->nRef--;
      pModule->xClose(pVCur);
      break;
    }
#endif
  }
}